

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_segment_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_84ef6b::AqSegmentTest_TestNoMisMatchExtDeltaQ_Test::TestBody
          (AqSegmentTest_TestNoMisMatchExtDeltaQ_Test *this)

{
  bool bVar1;
  char *in_RDI;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  I420VideoSource video;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff14;
  allocator *paVar3;
  int line;
  uint in_stack_ffffffffffffff30;
  uint in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  Type in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  uint in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff58;
  allocator local_89;
  string local_88 [16];
  Message *in_stack_ffffffffffffff88;
  AssertHelper *in_stack_ffffffffffffff90;
  undefined1 local_68 [104];
  
  in_RDI[0x90] = '\x02';
  in_RDI[0x91] = '\0';
  in_RDI[0x92] = '\0';
  in_RDI[0x93] = '\0';
  in_RDI[0x3f8] = '\0';
  in_RDI[0x3f9] = '\0';
  in_RDI[0x3fa] = '\0';
  in_RDI[0x3fb] = '\0';
  in_RDI[0x3fc] = '\x02';
  in_RDI[0x3fd] = '\0';
  in_RDI[0x3fe] = '\0';
  in_RDI[0x3ff] = '\0';
  paVar3 = &local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"hantro_collage_w352h288.yuv",paVar3);
  uVar2 = 0xf;
  libaom_test::I420VideoSource::I420VideoSource
            ((I420VideoSource *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (string *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,(int)((ulong)paVar3 >> 0x20),
             (int)paVar3,in_stack_ffffffffffffff50,in_stack_ffffffffffffff58);
  line = (int)((ulong)paVar3 >> 0x20);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      (**(code **)(*(long *)(in_RDI + 0x18) + 0x10))(in_RDI + 0x18,local_68);
    }
    bVar1 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure
                      ((HasNewFatalFailureHelper *)&stack0xffffffffffffff48);
    if (bVar1) {
      in_stack_ffffffffffffff44 = 2;
    }
    else {
      in_stack_ffffffffffffff44 = 0;
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)CONCAT44(in_stack_ffffffffffffff14,uVar2));
    if ((in_stack_ffffffffffffff44 == 0) || (in_stack_ffffffffffffff44 != 2)) goto LAB_00740ef0;
  }
  testing::Message::Message
            ((Message *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             in_stack_ffffffffffffff3c,
             (char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),line,in_RDI);
  testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff14,uVar2));
  testing::Message::~Message((Message *)0x740eaa);
LAB_00740ef0:
  libaom_test::I420VideoSource::~I420VideoSource((I420VideoSource *)0x740efd);
  return;
}

Assistant:

TEST_P(AqSegmentTest, TestNoMisMatchExtDeltaQ) {
  cfg_.rc_end_usage = AOM_CQ;
  aq_mode_ = 0;
  deltaq_mode_ = 2;
  ::libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352, 288,
                                       30, 1, 0, 15);

  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
}